

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O3

int run_test_pipe_bind_error_inval(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  uv_pipe_t server;
  undefined1 auStack_228 [264];
  undefined8 uStack_120;
  uv_pipe_t local_110;
  
  uStack_120._0_4_ = 0x16e629;
  uStack_120._4_4_ = 0;
  puVar2 = uv_default_loop();
  uStack_120._0_4_ = 0x16e638;
  uStack_120._4_4_ = 0;
  iVar1 = uv_pipe_init(puVar2,&local_110,0);
  if (iVar1 == 0) {
    uStack_120._0_4_ = 0x16e651;
    uStack_120._4_4_ = 0;
    iVar1 = uv_pipe_bind(&local_110,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_0016e6e1;
    uStack_120._0_4_ = 0x16e66a;
    uStack_120._4_4_ = 0;
    iVar1 = uv_pipe_bind(&local_110,"/tmp/uv-test-sock2");
    if (iVar1 != -0x16) goto LAB_0016e6e6;
    uStack_120._0_4_ = 0x16e680;
    uStack_120._4_4_ = 0;
    uv_close((uv_handle_t *)&local_110,close_cb);
    uStack_120._0_4_ = 0x16e685;
    uStack_120._4_4_ = 0;
    puVar2 = uv_default_loop();
    uStack_120._0_4_ = 0x16e68f;
    uStack_120._4_4_ = 0;
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (close_cb_called != 1) goto LAB_0016e6eb;
    uStack_120._0_4_ = 0x16e69d;
    uStack_120._4_4_ = 0;
    unaff_RBX = uv_default_loop();
    uStack_120._0_4_ = 0x16e6b1;
    uStack_120._4_4_ = 0;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    uStack_120._0_4_ = 0x16e6bb;
    uStack_120._4_4_ = 0;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    uStack_120._0_4_ = 0x16e6c0;
    uStack_120._4_4_ = 0;
    puVar2 = uv_default_loop();
    uStack_120._0_4_ = 0x16e6c8;
    uStack_120._4_4_ = 0;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      uStack_120._0_4_ = 0x16e6d1;
      uStack_120._4_4_ = 0;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    uStack_120._0_4_ = 0x16e6e1;
    uStack_120._4_4_ = 0;
    run_test_pipe_bind_error_inval_cold_1();
LAB_0016e6e1:
    uStack_120._0_4_ = 0x16e6e6;
    uStack_120._4_4_ = 0;
    run_test_pipe_bind_error_inval_cold_2();
LAB_0016e6e6:
    uStack_120._0_4_ = 0x16e6eb;
    uStack_120._4_4_ = 0;
    run_test_pipe_bind_error_inval_cold_3();
LAB_0016e6eb:
    uStack_120._0_4_ = 0x16e6f0;
    uStack_120._4_4_ = 0;
    run_test_pipe_bind_error_inval_cold_4();
  }
  uStack_120 = run_test_pipe_listen_without_bind;
  run_test_pipe_bind_error_inval_cold_5();
  uStack_120 = (code *)unaff_RBX;
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,(uv_pipe_t *)auStack_228,0);
  if (iVar1 == 0) {
    puVar2 = (uv_loop_t *)auStack_228;
    iVar1 = uv_listen((uv_stream_t *)puVar2,0x1000,(uv_connection_cb)0x0);
    if (iVar1 != -0x16) goto LAB_0016e7a1;
    uv_close((uv_handle_t *)auStack_228,close_cb);
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (close_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0016e7ab;
    }
  }
  else {
    run_test_pipe_listen_without_bind_cold_1();
LAB_0016e7a1:
    run_test_pipe_listen_without_bind_cold_2();
  }
  run_test_pipe_listen_without_bind_cold_3();
LAB_0016e7ab:
  run_test_pipe_listen_without_bind_cold_4();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(pipe_bind_error_inval) {
  uv_pipe_t server;
  int r;

  r = uv_pipe_init(uv_default_loop(), &server, 0);
  ASSERT(r == 0);
  r = uv_pipe_bind(&server, TEST_PIPENAME);
  ASSERT(r == 0);
  r = uv_pipe_bind(&server, TEST_PIPENAME_2);
  ASSERT(r == UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}